

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

void once_close_cb(uv_handle_t *handle)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b;
  int64_t eval_a;
  
  puts("ONCE_CLOSE_CB");
  if (handle == (uv_handle_t *)0x0) {
    pcVar5 = "!=";
    pcVar7 = "!=";
    lVar2 = 0;
    pcVar6 = "NULL";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar4 = "handle";
    uVar3 = 0x2c;
  }
  else {
    iVar1 = uv_is_active(handle);
    lVar2 = (long)iVar1;
    if (lVar2 == 0) {
      once_close_cb_called = once_close_cb_called + 1;
      return;
    }
    pcVar5 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar4 = "uv_is_active(handle)";
    uVar3 = 0x2d;
    pcVar7 = "==";
    pcVar6 = "0";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,lVar2,pcVar7,0);
  abort();
}

Assistant:

static void once_close_cb(uv_handle_t* handle) {
  printf("ONCE_CLOSE_CB\n");

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active(handle));

  once_close_cb_called++;
}